

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

void __thiscall
FNodeBuilder::FindPolyContainers
          (FNodeBuilder *this,TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *spots,
          TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *anchors)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int y1;
  FPolyStart *pFVar7;
  FPrivSeg *pFVar8;
  FPrivVert *pFVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int dy;
  uint j;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int y;
  ulong uVar17;
  FPolyStart *pFVar18;
  FPrivVert *pFVar19;
  DWORD local_84;
  int local_80;
  int local_7c;
  fixed_t bbox [4];
  
  local_80 = 1;
  uVar17 = 0;
  do {
    if (spots->Count <= uVar17) {
      return;
    }
    pFVar18 = spots->Array;
    bVar10 = GetPolyExtents(this,pFVar18[uVar17].polynum,bbox);
    if (bVar10) {
      pFVar18 = pFVar18 + uVar17;
      pFVar7 = anchors->Array;
      lVar16 = 0;
      do {
        lVar15 = lVar16;
        if ((ulong)anchors->Count * 0xc + 0xc == lVar15 + 0xc) goto LAB_0047451e;
        lVar16 = lVar15 + 0xc;
      } while (*(int *)((long)&pFVar7->polynum + lVar15) != pFVar18->polynum);
      iVar13 = (bbox[3] - bbox[2]) / 2 + bbox[2];
      iVar11 = (bbox[0] - bbox[1]) / 2 + bbox[1];
      iVar1 = pFVar18->x;
      iVar2 = pFVar18->y;
      iVar3 = *(int *)((long)&pFVar7->x + lVar15);
      iVar4 = *(int *)((long)&pFVar7->y + lVar15);
      local_7c = 0x7fffffff;
      lVar16 = 4;
      local_84 = 0xffffffff;
      for (uVar14 = 0; uVar14 < (this->Segs).Count; uVar14 = uVar14 + 1) {
        pFVar8 = (this->Segs).Array;
        pFVar9 = (this->Vertices).Array;
        iVar12 = *(int *)((long)pFVar8 + lVar16 + -4);
        iVar5 = *(int *)((long)&pFVar8->v1 + lVar16);
        iVar6 = pFVar9[iVar5].super_FSimpleVert.y;
        y1 = pFVar9[iVar12].super_FSimpleVert.y;
        dy = iVar6 - y1;
        if (((dy != 0) &&
            ((y = SUB84((double)((iVar2 - iVar4) +
                                SUB84((double)iVar11 * 1.52587890625e-05 + 103079215104.0,0)) *
                        1.52587890625e-05 + 103079215104.0,0), y <= iVar6 || (y <= y1)))) &&
           ((iVar6 <= y || (y1 <= y)))) {
          pFVar19 = pFVar9 + iVar12;
          iVar12 = (pFVar19->super_FSimpleVert).x;
          lVar15 = (long)pFVar9[iVar5].super_FSimpleVert.x - (long)iVar12;
          iVar12 = PointOnSide(SUB84((double)((iVar1 - iVar3) +
                                             SUB84((double)iVar13 * 1.52587890625e-05 +
                                                   103079215104.0,0)) * 1.52587890625e-05 +
                                     103079215104.0,0),y,iVar12,y1,(int)lVar15,dy);
          if ((iVar12 < 1) &&
             (iVar12 = ((pFVar19->super_FSimpleVert).x - pFVar18->x) +
                       (int)((ulong)((int)((((long)y - (long)(pFVar19->super_FSimpleVert).y) *
                                           0x40000000) / (long)dy) * lVar15) >> 0x1e),
             iVar12 < local_7c && -1 < iVar12)) {
            local_84 = (DWORD)uVar14;
            local_7c = iVar12;
          }
        }
        lVar16 = lVar16 + 0x48;
      }
      if (local_84 != 0xffffffff) {
        local_80 = MarkLoop(this,local_84,local_80);
      }
    }
LAB_0047451e:
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void FNodeBuilder::FindPolyContainers (TArray<FPolyStart> &spots, TArray<FPolyStart> &anchors)
{
	int loop = 1;

	for (unsigned int i = 0; i < spots.Size(); ++i)
	{
		FPolyStart *spot = &spots[i];
		fixed_t bbox[4];

		if (GetPolyExtents (spot->polynum, bbox))
		{
			FPolyStart *anchor = NULL;

			unsigned int j;

			for (j = 0; j < anchors.Size(); ++j)
			{
				anchor = &anchors[j];
				if (anchor->polynum == spot->polynum)
				{
					break;
				}
			}

			if (j < anchors.Size())
			{
				vertex_t mid;
				vertex_t center;

				mid.set(bbox[BOXLEFT] + (bbox[BOXRIGHT]-bbox[BOXLEFT])/2,
						bbox[BOXBOTTOM] + (bbox[BOXTOP]-bbox[BOXBOTTOM])/2);

				center.set(mid.fixX() - anchor->x + spot->x,
							mid.fixY() - anchor->y + spot->y);

				// Scan right for the seg closest to the polyobject's center after it
				// gets moved to its start spot.
				fixed_t closestdist = FIXED_MAX;
				unsigned int closestseg = UINT_MAX;

				P(Printf ("start %d,%d -- center %d, %d\n", spot->x>>16, spot->y>>16, center.fixX()>>16, center.fixY()>>16));

				for (unsigned int j = 0; j < Segs.Size(); ++j)
				{
					FPrivSeg *seg = &Segs[j];
					FPrivVert *v1 = &Vertices[seg->v1];
					FPrivVert *v2 = &Vertices[seg->v2];
					fixed_t dy = v2->y - v1->y;

					if (dy == 0)
					{ // Horizontal, so skip it
						continue;
					}
					if ((v1->y < center.fixY() && v2->y < center.fixY()) || (v1->y > center.fixY() && v2->y > center.fixY()))
					{ // Not crossed
						continue;
					}

					fixed_t dx = v2->x - v1->x;

					if (PointOnSide (center.fixX(), center.fixY(), v1->x, v1->y, dx, dy) <= 0)
					{
						fixed_t t = DivScale30 (center.fixY() - v1->y, dy);
						fixed_t sx = v1->x + MulScale30 (dx, t);
						fixed_t dist = sx - spot->x;

						if (dist < closestdist && dist >= 0)
						{
							closestdist = dist;
							closestseg = (long)j;
						}
					}
				}
				if (closestseg != UINT_MAX)
				{
					loop = MarkLoop (closestseg, loop);
					P(Printf ("Found polyobj in sector %d (loop %d)\n", Segs[closestseg].frontsector,
						Segs[closestseg].loopnum));
				}
			}
		}
	}
}